

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaTargetGenerator::GenerateSwiftOutputFileMap
          (cmNinjaTargetGenerator *this,string *config,string *flags)

{
  pointer pcVar1;
  cmGeneratorTarget *this_00;
  cmLocalNinjaGenerator *pcVar2;
  undefined1 auVar3 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
  *this_01;
  ValueHolder VVar4;
  bool bVar5;
  mapped_type *pmVar6;
  cmValue cVar7;
  string *psVar8;
  Value *pVVar9;
  cmGlobalNinjaGenerator *pcVar10;
  string *psVar11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string mapFilePath;
  string targetSwiftDepsPath;
  Value deps;
  cmGeneratedFileStream output;
  undefined1 local_390 [8];
  char *local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  string local_368;
  String local_348;
  string *local_328;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
  *local_320;
  ValueHolder local_318;
  ValueHolder local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8 [2];
  ValueHolder local_2c8;
  undefined1 *local_2c0;
  undefined1 local_2b8 [32];
  ValueHolder local_298;
  ValueHolder local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  size_type local_278;
  char *local_270;
  undefined8 local_268;
  undefined1 *local_260;
  size_type local_258;
  pointer local_250;
  undefined8 local_248;
  char *local_240;
  
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
           ::operator[](&this->Configs,config);
  bVar5 = Json::Value::empty(&pmVar6->SwiftOutputMap);
  if (!bVar5) {
    local_388 = local_380._M_local_buf + 8;
    pcVar1 = (config->_M_dataplus)._M_p;
    local_390 = (undefined1  [8])this;
    local_328 = flags;
    local_320 = &this->Configs;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_388,pcVar1,pcVar1 + config->_M_string_length);
    auVar3 = local_390;
    this_00 = *(cmGeneratorTarget **)((long)local_390 + 8);
    local_2c8.int_ = 0x17;
    local_298.string_ = (char *)&local_288;
    local_298.int_ = std::__cxx11::string::_M_create(&local_298.uint_,(ulong)&local_2c8);
    local_288._M_allocated_capacity = (size_type)local_2c8;
    builtin_strncpy((char *)local_298,"Swift_DE",8);
    *(char *)&(((_Rep_type *)local_298)->_M_impl).super__Rb_tree_header._M_header._M_color = 'P';
    *(char *)((long)&(((_Rep_type *)local_298)->_M_impl).super__Rb_tree_header._M_header._M_color +
             1) = 'E';
    *(char *)((long)&(((_Rep_type *)local_298)->_M_impl).super__Rb_tree_header._M_header._M_color +
             2) = 'N';
    *(char *)((long)&(((_Rep_type *)local_298)->_M_impl).super__Rb_tree_header._M_header._M_color +
             3) = 'D';
    (((_Rep_type *)local_298)->_M_impl).super__Rb_tree_header._M_header.field_0x4 = 'E';
    (((_Rep_type *)local_298)->_M_impl).super__Rb_tree_header._M_header.field_0x5 = 'N';
    (((_Rep_type *)local_298)->_M_impl).super__Rb_tree_header._M_header.field_0x6 = 'C';
    (((_Rep_type *)local_298)->_M_impl).super__Rb_tree_header._M_header.field_0x7 = 'I';
    (((_Rep_type *)local_298)->_M_impl).super__Rb_tree_header._M_header.field_0x7 = 'I';
    *(char *)&(((_Rep_type *)local_298)->_M_impl).super__Rb_tree_header._M_header._M_parent = 'E';
    *(char *)((long)&(((_Rep_type *)local_298)->_M_impl).super__Rb_tree_header._M_header._M_parent +
             1) = 'S';
    *(char *)((long)&(((_Rep_type *)local_298)->_M_impl).super__Rb_tree_header._M_header._M_parent +
             2) = '_';
    *(char *)((long)&(((_Rep_type *)local_298)->_M_impl).super__Rb_tree_header._M_header._M_parent +
             3) = 'F';
    *(char *)((long)&(((_Rep_type *)local_298)->_M_impl).super__Rb_tree_header._M_header._M_parent +
             4) = 'I';
    *(char *)((long)&(((_Rep_type *)local_298)->_M_impl).super__Rb_tree_header._M_header._M_parent +
             5) = 'L';
    *(char *)((long)&(((_Rep_type *)local_298)->_M_impl).super__Rb_tree_header._M_header._M_parent +
             6) = 'E';
    local_290.int_ = local_2c8.int_;
    local_298.string_[local_2c8.string_] = '\0';
    cVar7 = cmGeneratorTarget::GetProperty(this_00,(string *)&local_298);
    if (local_298 != &local_288) {
      operator_delete(local_298.string_,local_288._M_allocated_capacity + 1);
    }
    if (cVar7.Value == (string *)0x0) {
      cmGeneratorTarget::GetSupportDirectory_abi_cxx11_((string *)&local_318,this_00);
      VVar4 = local_318;
      paStack_2f0 = local_2e8;
      local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x1;
      local_2e8[0]._M_local_buf[0] = '/';
      psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
      local_298 = local_310;
      local_290 = VVar4;
      local_288._M_allocated_capacity = (size_type)local_2f8;
      local_288._8_8_ = paStack_2f0;
      local_278 = local_380._M_allocated_capacity;
      local_270 = local_388;
      local_2c0 = local_2b8;
      local_2c8.int_ = 1;
      local_2b8[0] = 0x2f;
      local_268 = 1;
      local_250 = (psVar8->_M_dataplus)._M_p;
      local_258 = psVar8->_M_string_length;
      local_248 = 10;
      local_240 = ".swiftdeps";
      views._M_len = 6;
      views._M_array = (iterator)&local_298;
      local_260 = local_2c0;
      cmCatViews_abi_cxx11_(&local_368,views);
      pcVar10 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator
                          (*(cmLocalNinjaGenerator **)((long)auVar3 + 0xb0));
      psVar8 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar10,&local_368);
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      pcVar1 = (psVar8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_348,pcVar1,pcVar1 + psVar8->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      if (local_318 != &local_308) {
        operator_delete(local_318.string_,local_308._M_allocated_capacity + 1);
      }
    }
    else {
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      pcVar1 = ((cVar7.Value)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_348,pcVar1,pcVar1 + (cVar7.Value)->_M_string_length);
    }
    if (local_388 != local_380._M_local_buf + 8) {
      operator_delete(local_388,local_380._8_8_ + 1);
    }
    cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
              (&local_368,(this->super_cmCommonTargetGenerator).GeneratorTarget);
    local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x1;
    local_2e8[0]._M_local_buf[0] = '/';
    local_298 = (ValueHolder)local_368._M_string_length;
    local_290 = (ValueHolder)local_368._M_dataplus._M_p;
    local_288._M_allocated_capacity = 1;
    local_270 = (config->_M_dataplus)._M_p;
    local_278 = config->_M_string_length;
    local_2c0 = local_2b8;
    local_2c8.int_ = 1;
    local_2b8[0] = 0x2f;
    local_268 = 1;
    local_258 = 0x14;
    local_250 = "output-file-map.json";
    views_00._M_len = 5;
    views_00._M_array = (iterator)&local_298;
    paStack_2f0 = local_2e8;
    local_288._8_8_ = local_2e8;
    local_260 = local_2c0;
    cmCatViews_abi_cxx11_((string *)local_390,views_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    Json::Value::Value((Value *)&local_2c8,objectValue);
    Json::Value::Value((Value *)&local_298,&local_348);
    pVVar9 = Json::Value::operator[]((Value *)&local_2c8,"swift-dependencies");
    Json::Value::operator=(pVVar9,(Value *)&local_298);
    Json::Value::~Value((Value *)&local_298);
    this_01 = local_320;
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
             ::operator[](local_320,config);
    pVVar9 = Json::Value::operator[](&pmVar6->SwiftOutputMap,"");
    Json::Value::operator=(pVVar9,(Value *)&local_2c8);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&local_298,(string *)local_390,false,None);
    psVar8 = local_328;
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
             ::operator[](this_01,config);
    Json::operator<<((OStream *)&local_298,&pmVar6->SwiftOutputMap);
    pcVar2 = this->LocalGenerator;
    local_2f8 = local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"-output-file-map","");
    (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
              (pcVar2,psVar8,&local_2f8);
    if (local_2f8 != local_2e8) {
      operator_delete(local_2f8,
                      CONCAT71(local_2e8[0]._M_allocated_capacity._1_7_,local_2e8[0]._M_local_buf[0]
                              ) + 1);
    }
    pcVar2 = this->LocalGenerator;
    pcVar10 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar2);
    psVar11 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar10,(string *)local_390);
    (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[8])
              (pcVar2,psVar8,psVar11);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&local_298);
    Json::Value::~Value((Value *)&local_2c8);
    if (local_390 != (undefined1  [8])&local_380) {
      operator_delete((void *)local_390,local_380._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::GenerateSwiftOutputFileMap(
  const std::string& config, std::string& flags)
{
  if (this->Configs[config].SwiftOutputMap.empty()) {
    return;
  }

  std::string const targetSwiftDepsPath = [this, config]() -> std::string {
    cmGeneratorTarget const* target = this->GeneratorTarget;
    if (cmValue name = target->GetProperty("Swift_DEPENDENCIES_FILE")) {
      return *name;
    }
    return this->ConvertToNinjaPath(cmStrCat(target->GetSupportDirectory(),
                                             '/', config, '/',
                                             target->GetName(), ".swiftdeps"));
  }();

  std::string mapFilePath =
    cmStrCat(this->GeneratorTarget->GetSupportDirectory(), '/', config, '/',
             "output-file-map.json");

  // build the global target dependencies
  // https://github.com/apple/swift/blob/master/docs/Driver.md#output-file-maps
  Json::Value deps(Json::objectValue);
  deps["swift-dependencies"] = targetSwiftDepsPath;
  this->Configs[config].SwiftOutputMap[""] = deps;

  cmGeneratedFileStream output(mapFilePath);
  output << this->Configs[config].SwiftOutputMap;

  // Add flag
  this->LocalGenerator->AppendFlags(flags, "-output-file-map");
  this->LocalGenerator->AppendFlagEscape(flags,
                                         ConvertToNinjaPath(mapFilePath));
}